

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void test_sort_helper(secp256k1_pubkey *pk,size_t *pk_order,size_t n_pk)

{
  int iVar1;
  size_t sVar2;
  uchar *p1;
  secp256k1_keypair *key32;
  secp256k1_keypair *keypair;
  long lVar3;
  size_t len;
  void *ndata;
  size_t msglen;
  secp256k1_pubkey **ppsVar4;
  uchar *msg;
  secp256k1_keypair *keypair_00;
  secp256k1_context *psVar5;
  uchar *nonce32;
  secp256k1_context *input32;
  int iVar6;
  secp256k1_keypair *xonly_pk32;
  secp256k1_keypair *psVar7;
  secp256k1_xonly_pubkey *pubkey;
  uchar *algo;
  secp256k1_pubkey *pk_test [5];
  secp256k1_xonly_pubkey sStackY_268;
  secp256k1_keypair *psStackY_228;
  uchar *puStackY_220;
  secp256k1_keypair *psStackY_218;
  code *pcStackY_210;
  secp256k1_schnorrsig_extraparams sStack_1f8;
  undefined1 auStack_1d8 [64];
  undefined1 auStack_198 [160];
  char acStack_f8 [64];
  secp256k1_context *psStack_b8;
  uchar auStack_90 [32];
  uchar auStack_70 [32];
  size_t sStack_50;
  secp256k1_pubkey *psStack_48;
  secp256k1_pubkey *local_38 [5];
  
  ppsVar4 = local_38;
  if (n_pk == 0) {
    secp256k1_pubkey_sort(CTX,local_38,0);
  }
  else {
    sVar2 = 0;
    do {
      local_38[sVar2] = pk + pk_order[sVar2];
      sVar2 = sVar2 + 1;
    } while (n_pk != sVar2);
    psVar5 = CTX;
    secp256k1_pubkey_sort(CTX,local_38,n_pk);
    sVar2 = 0;
    do {
      lVar3 = 0;
      do {
        ppsVar4 = (secp256k1_pubkey **)
                  CONCAT71((int7)((ulong)ppsVar4 >> 8),local_38[sVar2]->data[lVar3]);
        if (local_38[sVar2]->data[lVar3] != pk->data[lVar3]) {
          test_sort_helper_cold_1();
          nonce32 = auStack_90;
          msg = *(uchar **)&psVar5->ecmult_gen_ctx;
          key32 = (secp256k1_keypair *)(psVar5->ecmult_gen_ctx).blind.d[0];
          xonly_pk32 = (secp256k1_keypair *)(psVar5->ecmult_gen_ctx).blind.d[1];
          algo = (uchar *)(psVar5->ecmult_gen_ctx).blind.d[2];
          sStack_50 = n_pk;
          psStack_48 = pk;
          iVar1 = nonce_function_bip340
                            (auStack_90,msg,0x20,(uchar *)key32,(uchar *)xonly_pk32,algo,0xd,
                             (void *)(psVar5->ecmult_gen_ctx).blind.d[3]);
          if (iVar1 == 0) {
            nonce_function_bip340_bitflip_cold_3();
          }
          else {
            secp256k1_testrand_flip
                      ((uchar *)(psVar5->ecmult_gen_ctx).blind.d[(long)((long)ppsVar4 + -1)],len);
            nonce32 = auStack_70;
            msg = *(uchar **)&psVar5->ecmult_gen_ctx;
            key32 = (secp256k1_keypair *)(psVar5->ecmult_gen_ctx).blind.d[0];
            xonly_pk32 = (secp256k1_keypair *)(psVar5->ecmult_gen_ctx).blind.d[1];
            algo = (uchar *)(psVar5->ecmult_gen_ctx).blind.d[2];
            lVar3 = 0x20;
            iVar1 = nonce_function_bip340
                              (nonce32,msg,0x20,(uchar *)key32,(uchar *)xonly_pk32,algo,0xd,
                               (void *)(psVar5->ecmult_gen_ctx).blind.d[3]);
            if (iVar1 != 0) {
              do {
                if (auStack_90[lVar3 + -0x20] != auStack_90[lVar3]) {
                  return;
                }
                lVar3 = lVar3 + 1;
              } while (lVar3 != 0x40);
              nonce_function_bip340_bitflip_cold_1();
              return;
            }
          }
          nonce_function_bip340_bitflip_cold_2();
          sStack_1f8.magic[0] = 0xda;
          sStack_1f8.magic[1] = 'o';
          sStack_1f8.magic[2] = 0xb3;
          sStack_1f8.magic[3] = 0x8c;
          sStack_1f8._4_4_ = 0;
          sStack_1f8.noncefp = (secp256k1_nonce_function_hardened)0x0;
          keypair_00 = (secp256k1_keypair *)(auStack_198 + 0x40);
          pcStackY_210 = (code *)0x15dd3d;
          keypair = key32;
          input32 = CTX;
          psVar7 = xonly_pk32;
          psStack_b8 = psVar5;
          iVar1 = secp256k1_keypair_create(CTX,keypair_00,nonce32);
          iVar6 = (int)psVar7;
          if (iVar1 == 0) {
            pcStackY_210 = (code *)0x15de77;
            test_schnorrsig_bip_vectors_check_signing_cold_9();
          }
          else {
            keypair_00 = (secp256k1_keypair *)auStack_1d8;
            psVar7 = (secp256k1_keypair *)(auStack_198 + 0x40);
            pcStackY_210 = (code *)0x15dd69;
            keypair = xonly_pk32;
            input32 = CTX;
            iVar1 = secp256k1_schnorrsig_sign_custom
                              (CTX,(uchar *)keypair_00,key32->data,(size_t)xonly_pk32,psVar7,
                               &sStack_1f8);
            iVar6 = (int)psVar7;
            if (iVar1 != 0) {
              lVar3 = 0;
              goto LAB_0015dd73;
            }
          }
          pcStackY_210 = (code *)0x15de7c;
          test_schnorrsig_bip_vectors_check_signing_cold_8();
          goto LAB_0015de7c;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x40);
      sVar2 = sVar2 + 1;
      pk = pk + 1;
    } while (sVar2 != n_pk);
  }
  return;
  while (lVar3 = lVar3 + 1, lVar3 != 0x40) {
LAB_0015dd73:
    keypair = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair >> 8),auStack_1d8[lVar3]);
    if (auStack_1d8[lVar3] != algo[lVar3]) goto LAB_0015de90;
  }
  if (xonly_pk32 == (secp256k1_keypair *)0x20) {
    keypair_00 = (secp256k1_keypair *)auStack_1d8;
    auStack_1d8[0x30] = '\0';
    auStack_1d8[0x31] = '\0';
    auStack_1d8[0x32] = '\0';
    auStack_1d8[0x33] = '\0';
    auStack_1d8[0x34] = '\0';
    auStack_1d8[0x35] = '\0';
    auStack_1d8[0x36] = '\0';
    auStack_1d8[0x37] = '\0';
    auStack_1d8[0x38] = '\0';
    auStack_1d8[0x39] = '\0';
    auStack_1d8[0x3a] = '\0';
    auStack_1d8[0x3b] = '\0';
    auStack_1d8[0x3c] = '\0';
    auStack_1d8[0x3d] = '\0';
    auStack_1d8[0x3e] = '\0';
    auStack_1d8[0x3f] = '\0';
    auStack_1d8[0x20] = '\0';
    auStack_1d8[0x21] = '\0';
    auStack_1d8[0x22] = '\0';
    auStack_1d8[0x23] = '\0';
    auStack_1d8[0x24] = '\0';
    auStack_1d8[0x25] = '\0';
    auStack_1d8[0x26] = '\0';
    auStack_1d8[0x27] = '\0';
    auStack_1d8[0x28] = '\0';
    auStack_1d8[0x29] = '\0';
    auStack_1d8[0x2a] = '\0';
    auStack_1d8[0x2b] = '\0';
    auStack_1d8[0x2c] = '\0';
    auStack_1d8[0x2d] = '\0';
    auStack_1d8[0x2e] = '\0';
    auStack_1d8[0x2f] = '\0';
    auStack_1d8[0x10] = '\0';
    auStack_1d8[0x11] = '\0';
    auStack_1d8[0x12] = '\0';
    auStack_1d8[0x13] = '\0';
    auStack_1d8[0x14] = '\0';
    auStack_1d8[0x15] = '\0';
    auStack_1d8[0x16] = '\0';
    auStack_1d8[0x17] = '\0';
    auStack_1d8[0x18] = '\0';
    auStack_1d8[0x19] = '\0';
    auStack_1d8[0x1a] = '\0';
    auStack_1d8[0x1b] = '\0';
    auStack_1d8[0x1c] = '\0';
    auStack_1d8[0x1d] = '\0';
    auStack_1d8[0x1e] = '\0';
    auStack_1d8[0x1f] = '\0';
    auStack_1d8[0] = '\0';
    auStack_1d8[1] = '\0';
    auStack_1d8[2] = '\0';
    auStack_1d8[3] = '\0';
    auStack_1d8[4] = '\0';
    auStack_1d8[5] = '\0';
    auStack_1d8[6] = '\0';
    auStack_1d8[7] = '\0';
    auStack_1d8[8] = '\0';
    auStack_1d8[9] = '\0';
    auStack_1d8[10] = '\0';
    auStack_1d8[0xb] = '\0';
    auStack_1d8[0xc] = '\0';
    auStack_1d8[0xd] = '\0';
    auStack_1d8[0xe] = '\0';
    auStack_1d8[0xf] = '\0';
    psVar7 = (secp256k1_keypair *)(auStack_198 + 0x40);
    keypair = (secp256k1_keypair *)0x20;
    pcStackY_210 = (code *)0x15ddce;
    input32 = CTX;
    iVar1 = secp256k1_schnorrsig_sign_internal
                      (CTX,(uchar *)keypair_00,key32->data,0x20,psVar7,nonce_function_bip340,ndata);
    iVar6 = (int)psVar7;
    if (iVar1 == 0) goto LAB_0015de8b;
    lVar3 = 0;
    do {
      keypair = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair >> 8),auStack_1d8[lVar3]);
      if (auStack_1d8[lVar3] != algo[lVar3]) goto LAB_0015de9a;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
  }
  keypair_00 = (secp256k1_keypair *)acStack_f8;
  pcStackY_210 = (code *)0x15de06;
  input32 = CTX;
  iVar1 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)keypair_00,msg);
  if (iVar1 == 0) {
LAB_0015de7c:
    pcStackY_210 = (code *)0x15de81;
    test_schnorrsig_bip_vectors_check_signing_cold_6();
LAB_0015de81:
    pcStackY_210 = (code *)0x15de86;
    test_schnorrsig_bip_vectors_check_signing_cold_5();
  }
  else {
    keypair_00 = (secp256k1_keypair *)auStack_198;
    keypair = (secp256k1_keypair *)(auStack_198 + 0x40);
    pcStackY_210 = (code *)0x15de25;
    input32 = CTX;
    iVar1 = secp256k1_keypair_xonly_pub(CTX,(secp256k1_xonly_pubkey *)keypair_00,(int *)0x0,keypair)
    ;
    if (iVar1 == 0) goto LAB_0015de81;
    lVar3 = 0;
    do {
      keypair = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair >> 8),auStack_198[lVar3]);
      if (auStack_198[lVar3] != acStack_f8[lVar3]) goto LAB_0015de95;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    keypair_00 = (secp256k1_keypair *)auStack_1d8;
    pubkey = (secp256k1_xonly_pubkey *)auStack_198;
    pcStackY_210 = (code *)0x15de5d;
    keypair = xonly_pk32;
    input32 = CTX;
    iVar1 = secp256k1_schnorrsig_verify
                      (CTX,(uchar *)keypair_00,key32->data,(size_t)xonly_pk32,pubkey);
    iVar6 = (int)pubkey;
    if (iVar1 != 0) {
      return;
    }
  }
  pcStackY_210 = (code *)0x15de8b;
  test_schnorrsig_bip_vectors_check_signing_cold_4();
LAB_0015de8b:
  pcStackY_210 = (code *)0x15de90;
  test_schnorrsig_bip_vectors_check_signing_cold_7();
LAB_0015de90:
  pcStackY_210 = (code *)0x15de95;
  test_schnorrsig_bip_vectors_check_signing_cold_1();
LAB_0015de95:
  pcStackY_210 = (code *)0x15de9a;
  test_schnorrsig_bip_vectors_check_signing_cold_3();
LAB_0015de9a:
  pcStackY_210 = test_schnorrsig_bip_vectors_check_verify;
  test_schnorrsig_bip_vectors_check_signing_cold_2();
  psStackY_228 = xonly_pk32;
  puStackY_220 = algo;
  psStackY_218 = key32;
  pcStackY_210 = (code *)msg;
  iVar1 = secp256k1_xonly_pubkey_parse(CTX,&sStackY_268,(uchar *)input32);
  if (iVar1 == 0) {
    test_schnorrsig_bip_vectors_check_verify_cold_2();
  }
  else {
    iVar1 = secp256k1_schnorrsig_verify(CTX,keypair->data,keypair_00->data,msglen,&sStackY_268);
    if (iVar1 == iVar6) {
      return;
    }
  }
  test_schnorrsig_bip_vectors_check_verify_cold_1();
  return;
}

Assistant:

static void test_sort_helper(secp256k1_pubkey *pk, size_t *pk_order, size_t n_pk) {
    size_t i;
    const secp256k1_pubkey *pk_test[5];

    for (i = 0; i < n_pk; i++) {
        pk_test[i] = &pk[pk_order[i]];
    }
    secp256k1_pubkey_sort(CTX, pk_test, n_pk);
    for (i = 0; i < n_pk; i++) {
        CHECK(secp256k1_memcmp_var(pk_test[i], &pk[i], sizeof(*pk_test[i])) == 0);
    }
}